

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall CCard::CCard(CCard *this,istream *in)

{
  byte bVar1;
  int iVar2;
  runtime_error *this_00;
  string local_58 [32];
  size_type *local_38;
  string card;
  
  this->m_value = 0;
  this->m_suit = 0;
  local_38 = &card._M_string_length;
  card._M_dataplus._M_p = (pointer)0x0;
  card._M_string_length._0_1_ = 0;
  std::operator>>(in,(string *)&local_38);
  std::istream::ignore();
  bVar1 = (byte)*local_38;
  if ((char)bVar1 < 0x32) {
    if (bVar1 != 0x31) goto LAB_001028d0;
    this->m_value = 10;
    std::__cxx11::string::substr((ulong)local_58,(ulong)&local_38);
  }
  else if (bVar1 < 0x3a) {
    this->m_value = (char)bVar1 + -0x30;
    std::__cxx11::string::substr((ulong)local_58,(ulong)&local_38);
  }
  else if (bVar1 == 0x41) {
    this->m_value = 0xe;
    std::__cxx11::string::substr((ulong)local_58,(ulong)&local_38);
  }
  else if (bVar1 == 0x51) {
    this->m_value = 0xc;
    std::__cxx11::string::substr((ulong)local_58,(ulong)&local_38);
  }
  else if (bVar1 == 0x4b) {
    this->m_value = 0xd;
    std::__cxx11::string::substr((ulong)local_58,(ulong)&local_38);
  }
  else {
    if (bVar1 != 0x4a) goto LAB_001028d0;
    this->m_value = 0xb;
    std::__cxx11::string::substr((ulong)local_58,(ulong)&local_38);
  }
  std::__cxx11::string::operator=((string *)&local_38,local_58);
  std::__cxx11::string::~string(local_58);
LAB_001028d0:
  bVar1 = (byte)*local_38;
  if (bVar1 == 0x43) {
    iVar2 = 3;
  }
  else if (bVar1 == 0x44) {
    iVar2 = 1;
  }
  else if (bVar1 == 0x53) {
    iVar2 = 4;
  }
  else {
    if (bVar1 != 0x48) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unexpected suit");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = 2;
  }
  this->m_suit = iVar2;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

CCard(std::istream& in): m_value(0), m_suit(0)
        {
            std::string card;
            in >> card;
            in.ignore();
            if ('2' <= card[0] && '9' >= card[0])
            {
                m_value = card[0] - '0';
                card = card.substr(1);
            }
            else if ('1' == card[0])
            {
                m_value = 10;
                card = card.substr(2);
            }
            else if ('J' == card[0])
            {
                m_value = 11;
                card = card.substr(1);
            }
            else if ('Q' == card[0])
            {
                m_value = 12;
                card = card.substr(1);
            }
            else if ('K' == card[0])
            {
                m_value = 13;
                card = card.substr(1);
            }
            else if ('A' == card[0])
            {
                m_value = 14;
                card = card.substr(1);
            }
            
            switch (card[0])
            {
                case 'D':
                    m_suit = 1;
                    break;
                    
                case 'H':
                    m_suit = 2;
                    break;
                    
                case 'C':
                    m_suit = 3;
                    break;
                    
                case 'S':
                    m_suit = 4;
                    break;
                    
                default:
                    throw std::runtime_error("Unexpected suit");
            }
        }